

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O2

lzma_ret get_options(lzma_mt *options,lzma_options_easy *opt_easy,lzma_filter **filters,
                    uint64_t *block_size,uint64_t *outbuf_size_max)

{
  _Bool _Var1;
  ulong uncompressed_size;
  uint64_t uVar2;
  lzma_options_easy *filters_00;
  lzma_ret lVar3;
  
  if (options == (lzma_mt *)0x0) {
    lVar3 = LZMA_PROG_ERROR;
  }
  else {
    lVar3 = LZMA_OPTIONS_ERROR;
    if ((options->flags == 0) && (0xffffbfff < options->threads - 0x4001)) {
      filters_00 = (lzma_options_easy *)options->filters;
      if (((lzma_options_easy *)options->filters == (lzma_options_easy *)0x0) &&
         (_Var1 = lzma_easy_preset(opt_easy,options->preset), filters_00 = opt_easy, _Var1)) {
        return LZMA_OPTIONS_ERROR;
      }
      *filters = filters_00->filters;
      uncompressed_size = options->block_size;
      if (uncompressed_size == 0) {
        uncompressed_size = lzma_mt_block_size(filters_00->filters);
        *block_size = uncompressed_size;
        if (uncompressed_size == 0) {
          return LZMA_OPTIONS_ERROR;
        }
        if (0x3ffffffffffff < uncompressed_size) {
          __assert_fail("*block_size <= BLOCK_SIZE_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                        ,0x385,
                        "lzma_ret get_options(const lzma_mt *, lzma_options_easy *, const lzma_filter **, uint64_t *, uint64_t *)"
                       );
        }
      }
      else {
        if (uncompressed_size >> 0x32 != 0) {
          return LZMA_OPTIONS_ERROR;
        }
        *block_size = uncompressed_size;
      }
      uVar2 = lzma_block_buffer_bound64(uncompressed_size);
      *outbuf_size_max = uVar2;
      lVar3 = (uint)(uVar2 == 0) * 5;
    }
  }
  return lVar3;
}

Assistant:

static lzma_ret
get_options(const lzma_mt *options, lzma_options_easy *opt_easy,
		const lzma_filter **filters, uint64_t *block_size,
		uint64_t *outbuf_size_max)
{
	// Validate some of the options.
	if (options == NULL)
		return LZMA_PROG_ERROR;

	if (options->flags != 0 || options->threads == 0
			|| options->threads > LZMA_THREADS_MAX)
		return LZMA_OPTIONS_ERROR;

	if (options->filters != NULL) {
		// Filter chain was given, use it as is.
		*filters = options->filters;
	} else {
		// Use a preset.
		if (lzma_easy_preset(opt_easy, options->preset))
			return LZMA_OPTIONS_ERROR;

		*filters = opt_easy->filters;
	}

	// Block size
	if (options->block_size > 0) {
		if (options->block_size > BLOCK_SIZE_MAX)
			return LZMA_OPTIONS_ERROR;

		*block_size = options->block_size;
	} else {
		// Determine the Block size from the filter chain.
		*block_size = lzma_mt_block_size(*filters);
		if (*block_size == 0)
			return LZMA_OPTIONS_ERROR;

		assert(*block_size <= BLOCK_SIZE_MAX);
	}

	// Calculate the maximum amount output that a single output buffer
	// may need to hold. This is the same as the maximum total size of
	// a Block.
	*outbuf_size_max = lzma_block_buffer_bound64(*block_size);
	if (*outbuf_size_max == 0)
		return LZMA_MEM_ERROR;

	return LZMA_OK;
}